

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texture.c
# Opt level: O3

ktx_size_t ktxTexture_layerSize(ktxTexture *This,ktx_uint32_t level,ktxFormatVersionEnum fv)

{
  uint uVar1;
  ktx_size_t kVar2;
  uint uVar3;
  ulong uVar4;
  
  if (This == (ktxTexture *)0x0) {
    __assert_fail("This != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/lib/texture.c"
                  ,0x2b9,
                  "ktx_size_t ktxTexture_layerSize(ktxTexture *, ktx_uint32_t, ktxFormatVersionEnum)"
                 );
  }
  uVar1 = (This->_protected->_formatSize).blockDepth;
  if (uVar1 != 0) {
    uVar3 = (uVar1 + (This->baseDepth >> ((byte)level & 0x1f))) - 1;
    uVar4 = (ulong)uVar3 / (ulong)uVar1;
    if (uVar3 < uVar1) {
      uVar4 = 1;
    }
    kVar2 = ktxTexture_calcImageSize(This,level,fv);
    return kVar2 * This->numFaces * uVar4;
  }
  __assert_fail("prtctd->_formatSize.blockDepth != 0",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/lib/texture.c"
                ,0x2ba,
                "ktx_size_t ktxTexture_layerSize(ktxTexture *, ktx_uint32_t, ktxFormatVersionEnum)")
  ;
}

Assistant:

ktx_size_t
ktxTexture_layerSize(ktxTexture* This, ktx_uint32_t level,
                    ktxFormatVersionEnum fv)
{
    /*
     * As there are no 3D cubemaps, the image's z block count will always be
     * 1 for cubemaps and numFaces will always be 1 for 3D textures so the
     * multiply is safe. 3D cubemaps, if they existed, would require
     * imageSize * (blockCount.z + This->numFaces);
     */
    DECLARE_PROTECTED(ktxTexture);
    ktx_uint32_t blockCountZ;
    ktx_size_t imageSize, layerSize;

    assert (This != NULL);
    assert (prtctd->_formatSize.blockDepth != 0);

    blockCountZ = ((This->baseDepth >> level) + prtctd->_formatSize.blockDepth - 1) / prtctd->_formatSize.blockDepth;
    blockCountZ = MAX(1, blockCountZ);
    imageSize = ktxTexture_calcImageSize(This, level, fv);
    layerSize = imageSize * blockCountZ;
    if (fv == KTX_FORMAT_VERSION_ONE && KTX_GL_UNPACK_ALIGNMENT != 4) {
        if (This->isCubemap && !This->isArray) {
            /* cubePadding. NOTE: this adds padding after the last face too. */
            layerSize += _KTX_PAD4(layerSize);
        }
    }
    return layerSize * This->numFaces;
}